

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPTCPTransmitter::Create
          (RTPTCPTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  RTPAbortDescriptors *pRVar1;
  int iVar2;
  
  if (this->m_init != true) {
    return -0xb5;
  }
  if (this->m_created != false) {
    return -0xb7;
  }
  if (transparams != (RTPTransmissionParams *)0x0) {
    if (transparams->protocol != TCPProto) {
      return -0xb8;
    }
    pRVar1 = (RTPAbortDescriptors *)transparams[1]._vptr_RTPTransmissionParams;
    if (pRVar1 != (RTPAbortDescriptors *)0x0) {
      this->m_pAbortDesc = pRVar1;
      if (pRVar1->m_init != true) {
        return -0xae;
      }
      goto LAB_00127074;
    }
  }
  iVar2 = RTPAbortDescriptors::Init(&this->m_abortDesc);
  if (iVar2 < 0) {
    return iVar2;
  }
  this->m_pAbortDesc = &this->m_abortDesc;
LAB_00127074:
  this->m_created = true;
  this->m_waitingForData = false;
  return 0;
}

Assistant:

int RTPTCPTransmitter::Create(size_t maximumpacketsize, const RTPTransmissionParams *transparams)
{
	JRTPLIB_UNUSED(maximumpacketsize);
	const RTPTCPTransmissionParams *params,defaultparams;
	int status;

	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = &defaultparams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::TCPProto)
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_TCPTRANS_ILLEGALPARAMETERS;
		}
		params = static_cast<const RTPTCPTransmissionParams *>(transparams);
	}

	if (!params->GetCreatedAbortDescriptors())
	{
		if ((status = m_abortDesc.Init()) < 0)
		{
			MAINMUTEX_UNLOCK
			return status;
		}
		m_pAbortDesc = &m_abortDesc;
	}
	else
	{
		m_pAbortDesc = params->GetCreatedAbortDescriptors();
		if (!m_pAbortDesc->IsInitialized())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_ABORTDESC_NOTINIT;
		}
	}

	m_waitingForData = false;
	m_created = true;
	MAINMUTEX_UNLOCK 
	return 0;
}